

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

Type __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSupertype
          (HeapTypeGeneratorImpl *this,Type type)

{
  bool bVar1;
  Nullability NVar2;
  size_t __n;
  uintptr_t *puVar3;
  HeapType HVar4;
  Iterator IVar5;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar6;
  Ref RVar7;
  Ref ref;
  value_type local_80;
  uintptr_t local_78;
  Type t;
  Iterator __end3;
  Iterator __begin3;
  Type *__range3;
  undefined1 local_38 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  HeapTypeGeneratorImpl *this_local;
  Type type_local;
  
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  this_local = (HeapTypeGeneratorImpl *)type.id;
  bVar1 = Type::isTuple((Type *)&this_local);
  if (bVar1) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
    __n = Type::size((Type *)&this_local);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38,__n);
    IVar5 = Type::begin((Type *)&this_local);
    __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)IVar5.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    PVar6 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            Type::end((Type *)&this_local);
    while( true ) {
      __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar6.index;
      t.id = (uintptr_t)PVar6.parent;
      bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                         &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t
                        );
      if (!bVar1) break;
      puVar3 = (uintptr_t *)
               wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &__end3.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
      local_78 = *puVar3;
      local_80.id = (uintptr_t)generateSupertype(this,local_78);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38,&local_80);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
      PVar6.index = (size_t)__end3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent;
      PVar6.parent = (Type *)t.id;
    }
    type_local.id = wasm::TypeBuilder::getTempTupleType((vector *)this->builder);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  }
  else {
    bVar1 = Type::isRef((Type *)&this_local);
    if (bVar1) {
      HVar4 = Type::getHeapType((Type *)&this_local);
      NVar2 = Type::getNullability((Type *)&this_local);
      RVar7.nullability = NVar2;
      RVar7.type.id = HVar4.id;
      RVar7._12_4_ = 0;
      RVar7 = generateSuperRef(this,RVar7);
      type_local.id =
           wasm::TypeBuilder::getTempRefType
                     ((HeapType)this->builder,(Nullability)RVar7.type.id,RVar7.nullability);
    }
    else {
      bVar1 = Type::isBasic((Type *)&this_local);
      if (!bVar1) {
        wasm::handle_unreachable
                  ("unexpected type kind",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                   ,0x253);
      }
      type_local.id = (uintptr_t)this_local;
    }
  }
  return (Type)type_local.id;
}

Assistant:

Type generateSupertype(Type type) {
    if (type.isTuple()) {
      std::vector<Type> types;
      types.reserve(type.size());
      for (auto t : type) {
        types.push_back(generateSupertype(t));
      }
      return builder.getTempTupleType(types);
    } else if (type.isRef()) {
      auto ref = generateSuperRef({type.getHeapType(), type.getNullability()});
      return builder.getTempRefType(ref.type, ref.nullability);
    } else if (type.isBasic()) {
      // Non-reference basic types do not have supertypes.
      return type;
    } else {
      WASM_UNREACHABLE("unexpected type kind");
    }
  }